

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

InstructionNode * __thiscall
Lodtalk::MethodAssembler::Assembler::pushLiteral(Assembler *this,Oop literal)

{
  bool bVar1;
  size_t sVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  anon_union_8_4_0eb573b0_for_Oop_0 local_30;
  anon_union_8_4_0eb573b0_for_Oop_0 local_28;
  Assembler *local_20;
  Assembler *this_local;
  Oop literal_local;
  
  local_20 = this;
  this_local = (Assembler *)literal.field_0;
  local_28 = (anon_union_8_4_0eb573b0_for_Oop_0)nilOop();
  bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_28);
  if (bVar1) {
    literal_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pushNil(this);
  }
  else {
    local_30 = (anon_union_8_4_0eb573b0_for_Oop_0)trueOop();
    bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_30);
    if (bVar1) {
      literal_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pushTrue(this);
    }
    else {
      local_38 = (anon_union_8_4_0eb573b0_for_Oop_0)falseOop();
      bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_38);
      if (bVar1) {
        literal_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pushFalse(this);
      }
      else {
        local_40 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(1);
        bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_40);
        if (bVar1) {
          literal_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pushOne(this);
        }
        else {
          local_48 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(0);
          bVar1 = Oop::operator==((Oop *)&this_local,(Oop *)&local_48);
          if (bVar1) {
            literal_local.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pushZero(this);
          }
          else {
            sVar2 = addLiteral(this,(Oop)this_local);
            literal_local.field_0 =
                 (anon_union_8_4_0eb573b0_for_Oop_0)pushLiteralIndex(this,(int)sVar2);
          }
        }
      }
    }
  }
  return (InstructionNode *)literal_local.field_0.pointer;
}

Assistant:

InstructionNode *Assembler::pushLiteral(Oop literal)
{
    if(literal == nilOop())
        return pushNil();
    if(literal == trueOop())
        return pushTrue();
    if(literal == falseOop())
        return pushFalse();
    if(literal == Oop::encodeSmallInteger(1))
        return pushOne();
    if(literal == Oop::encodeSmallInteger(0))
        return pushZero();

	return pushLiteralIndex((int)addLiteral(literal));
}